

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

Aig_Man_t * Cec_ComputeChoices(Gia_Man_t *pGia,Dch_Pars_t *pPars)

{
  int nRegs;
  Gia_Man_t *p;
  Aig_Man_t *pAVar1;
  Aig_Man_t *pAig;
  Cec_ParChc_t *pParsChc;
  Cec_ParChc_t ParsChc;
  Dch_Pars_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  ParsChc._20_8_ = pPars;
  if (pPars->fVerbose != 0) {
    Abc_PrintTime(1,"Synthesis time",pPars->timeSynth);
  }
  Cec_ManChcSetDefaultParams((Cec_ParChc_t *)((long)&pParsChc + 4));
  ParsChc.nWords = *(int *)(ParsChc._20_8_ + 4);
  ParsChc.nBTLimit = *(int *)(ParsChc._20_8_ + 0x20);
  if ((ParsChc.nBTLimit != 0) && (100 < ParsChc.nWords)) {
    ParsChc.nWords = 100;
  }
  ParsChc.fUseCSat = *(int *)(ParsChc._20_8_ + 0x2c);
  p = Cec_ManChoiceComputationVec(pGia,3,(Cec_ParChc_t *)((long)&pParsChc + 4));
  nRegs = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p,nRegs);
  pAVar1 = Gia_ManToAig(p,1);
  Gia_ManStop(p);
  return pAVar1;
}

Assistant:

Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars )
{
    Cec_ParChc_t ParsChc, * pParsChc = &ParsChc;
    Aig_Man_t * pAig;
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Synthesis time", pPars->timeSynth );
    Cec_ManChcSetDefaultParams( pParsChc );
    pParsChc->nBTLimit = pPars->nBTLimit;
    pParsChc->fUseCSat = pPars->fUseCSat;
    if ( pParsChc->fUseCSat && pParsChc->nBTLimit > 100 )
        pParsChc->nBTLimit = 100;
    pParsChc->fVerbose = pPars->fVerbose;
    pGia = Cec_ManChoiceComputationVec( pGia, 3, pParsChc );
    Gia_ManSetRegNum( pGia, Gia_ManRegNum(pGia) );
    pAig = Gia_ManToAig( pGia, 1 );
    Gia_ManStop( pGia );
    return pAig;
}